

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::StackIRGenerator::emit(StackIRGenerator *this,Expression *curr)

{
  Id IVar1;
  Op op;
  StackInst *local_18;
  
  IVar1 = curr->_id;
  if (IVar1 == TryTableId) {
    op = TryTableBegin;
  }
  else if (IVar1 == IfId) {
    op = IfBegin;
  }
  else if (IVar1 == LoopId) {
    op = LoopBegin;
  }
  else if (IVar1 == TryId) {
    op = TryBegin;
  }
  else {
    if (IVar1 != BlockId) {
      local_18 = makeStackInst(this,curr);
      goto LAB_00cef3fe;
    }
    op = BlockBegin;
  }
  local_18 = makeStackInst(this,op,curr);
LAB_00cef3fe:
  std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::push_back
            (&this->stackIR,&local_18);
  return;
}

Assistant:

void StackIRGenerator::emit(Expression* curr) {
  StackInst* stackInst = nullptr;
  if (curr->is<Block>()) {
    stackInst = makeStackInst(StackInst::BlockBegin, curr);
  } else if (curr->is<If>()) {
    stackInst = makeStackInst(StackInst::IfBegin, curr);
  } else if (curr->is<Loop>()) {
    stackInst = makeStackInst(StackInst::LoopBegin, curr);
  } else if (curr->is<Try>()) {
    stackInst = makeStackInst(StackInst::TryBegin, curr);
  } else if (curr->is<TryTable>()) {
    stackInst = makeStackInst(StackInst::TryTableBegin, curr);
  } else {
    stackInst = makeStackInst(curr);
  }
  stackIR.push_back(stackInst);
}